

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_collision_bench.cc
# Opt level: O0

void RandomCommand(char **s)

{
  long lVar1;
  char *pcVar2;
  long lVar3;
  int local_18;
  int i;
  int len;
  char **s_local;
  
  lVar1 = random();
  pcVar2 = (char *)operator_new__((long)(int)lVar1);
  *s = pcVar2;
  for (local_18 = 0; local_18 < (int)lVar1; local_18 = local_18 + 1) {
    lVar3 = random();
    (*s)[local_18] = (char)lVar3;
  }
  return;
}

Assistant:

void RandomCommand(char** s) {
  int len = random(5, 100);
  *s = new char[len];
  for (int i = 0; i < len; ++i)
    (*s)[i] = (char)random(32, 127);
}